

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcEdgeLogDerivativesPartials
          (BeagleCPUImpl<double,_1,_0> *this,double *postOrderPartial,double *preOrderPartial,
          int firstDerivativeIndex,int secondDerivativeIndex,double *categoryRates,
          double *categoryWeights,int scalingFactorsIndex,double *outDerivatives,
          double *outSumDerivatives,double *outSumSquaredDerivatives)

{
  double dVar1;
  double *pdVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  int j;
  double sumOverEndState;
  int k;
  double denominator;
  double numerator;
  int v;
  int patternIndex;
  int w;
  int pattern;
  double weight;
  int category;
  double *firstDerivMatrix;
  double *categoryRates_local;
  int secondDerivativeIndex_local;
  int firstDerivativeIndex_local;
  double *preOrderPartial_local;
  double *postOrderPartial_local;
  BeagleCPUImpl<double,_1,_0> *this_local;
  
  pdVar2 = this->gTransitionMatrices[firstDerivativeIndex];
  for (category = 0; category < this->kCategoryCount; category = category + 1) {
    dVar1 = categoryWeights[category];
    for (pattern = 0; pattern < this->kPatternCount; pattern = pattern + 1) {
      w = category * this->kMatrixSize;
      iVar3 = (category * this->kPatternCount + pattern) * this->kPartialsPaddedStateCount;
      numerator = 0.0;
      denominator = 0.0;
      for (k = 0; k < this->kStateCount; k = k + 1) {
        sumOverEndState = 0.0;
        for (j = 0; j < this->kStateCount; j = j + 1) {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = pdVar2[w];
          auVar4._8_8_ = 0;
          auVar4._0_8_ = postOrderPartial[iVar3 + j];
          auVar14._8_8_ = 0;
          auVar14._0_8_ = sumOverEndState;
          auVar7 = vfmadd213sd_fma(auVar4,auVar9,auVar14);
          sumOverEndState = auVar7._0_8_;
          w = w + 1;
        }
        w = w + 1;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = sumOverEndState;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = preOrderPartial[iVar3 + k];
        auVar15._8_8_ = 0;
        auVar15._0_8_ = numerator;
        auVar7 = vfmadd213sd_fma(auVar5,auVar10,auVar15);
        numerator = auVar7._0_8_;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = postOrderPartial[iVar3 + k];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = preOrderPartial[iVar3 + k];
        auVar16._8_8_ = 0;
        auVar16._0_8_ = denominator;
        auVar7 = vfmadd213sd_fma(auVar6,auVar11,auVar16);
        denominator = auVar7._0_8_;
      }
      auVar12._8_8_ = 0;
      auVar12._0_8_ = dVar1;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = numerator;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = this->grandNumeratorDerivTmp[pattern];
      auVar7 = vfmadd213sd_fma(auVar7,auVar12,auVar17);
      this->grandNumeratorDerivTmp[pattern] = auVar7._0_8_;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = dVar1;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = denominator;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = this->grandDenominatorDerivTmp[pattern];
      auVar7 = vfmadd213sd_fma(auVar8,auVar13,auVar18);
      this->grandDenominatorDerivTmp[pattern] = auVar7._0_8_;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcEdgeLogDerivativesPartials(const REALTYPE *postOrderPartial,
                                                                       const REALTYPE *preOrderPartial,
                                                                       const int firstDerivativeIndex,
                                                                       const int secondDerivativeIndex,
                                                                       const double *categoryRates,
                                                                       const REALTYPE *categoryWeights,
                                                                       const int scalingFactorsIndex,
//                                                                       const REALTYPE *cumulativeScaleBuffer,
                                                                       double *outDerivatives,
                                                                       double *outSumDerivatives,
                                                                       double *outSumSquaredDerivatives) {

    const REALTYPE *firstDerivMatrix = gTransitionMatrices[firstDerivativeIndex];

    for (int category = 0; category < kCategoryCount; category++) {
        const REALTYPE weight = categoryWeights[category];

        for (int pattern = 0; pattern < kPatternCount; pattern++) {

            int w = category * kMatrixSize;

            const int patternIndex = category * kPatternCount + pattern;
            const int v = patternIndex * kPartialsPaddedStateCount;

            REALTYPE numerator = 0.0;
            REALTYPE denominator = 0.0;

            for (int k = 0; k < kStateCount; k++) {

                REALTYPE sumOverEndState = 0.0;
                for (int j = 0; j < kStateCount; j++) {
                    sumOverEndState += firstDerivMatrix[w]
                                       * postOrderPartial[v + j]; // fix padded index
                    w++;
                }
                w += T_PAD;

                numerator += sumOverEndState * preOrderPartial[v + k];
                denominator += postOrderPartial[v + k] * preOrderPartial[v + k];
            }

            grandNumeratorDerivTmp[pattern] += weight * numerator;
            grandDenominatorDerivTmp[pattern] += weight * denominator;
        }
    }
}